

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O1

CallInfo * growCI(lua_State *L)

{
  int *piVar1;
  StkId pTVar2;
  int iVar3;
  CallInfo *pCVar4;
  int iVar5;
  StkId pTVar6;
  StkId pTVar7;
  
  if (L->size_ci < 0x4e21) {
    luaD_reallocCI(L,L->size_ci * 2);
    if (20000 < L->size_ci) {
      luaG_runerror(L,"stack overflow");
    }
    pCVar4 = L->ci;
    L->ci = pCVar4 + 1;
    return pCVar4 + 1;
  }
  pTVar7 = (StkId)0x5;
  luaD_throw(L,5);
  if ((L->hookmask & 2) != 0) {
    pTVar6 = L->stack;
    luaD_callhook(L,1,-1);
    if ((((L->ci->func->value).gc)->h).flags == '\0') {
      while ((L->hookmask & 2) != 0) {
        piVar1 = &L->ci->tailcalls;
        iVar3 = *piVar1;
        *piVar1 = *piVar1 + -1;
        if (iVar3 == 0) break;
        luaD_callhook(L,4,-1);
      }
    }
    pTVar7 = (StkId)(((long)pTVar7 - (long)pTVar6) + (long)L->stack);
  }
  pCVar4 = L->ci;
  L->ci = pCVar4 + -1;
  pTVar6 = pCVar4->func;
  iVar3 = pCVar4->nresults;
  L->base = pCVar4[-1].base;
  L->savedpc = pCVar4[-1].savedpc;
  iVar5 = iVar3;
  if (iVar3 != 0) {
    do {
      if (L->top <= pTVar7) goto LAB_0010ad44;
      pTVar2 = pTVar6 + 1;
      pTVar6->value = pTVar7->value;
      pTVar6->tt = pTVar7->tt;
      pTVar7 = pTVar7 + 1;
      iVar5 = iVar5 + -1;
      pTVar6 = pTVar2;
    } while (iVar5 != 0);
    iVar5 = 0;
  }
LAB_0010ad44:
  if (0 < iVar5) {
    iVar5 = iVar5 + 1;
    do {
      pTVar6->tt = 0;
      pTVar6 = pTVar6 + 1;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  L->top = pTVar6;
  return (CallInfo *)(ulong)(iVar3 + 1);
}

Assistant:

static CallInfo *growCI (lua_State *L) {
  if (L->size_ci > LUAI_MAXCALLS)  /* overflow while handling overflow? */
    luaD_throw(L, LUA_ERRERR);
  else {
    luaD_reallocCI(L, 2*L->size_ci);
    if (L->size_ci > LUAI_MAXCALLS)
      luaG_runerror(L, "stack overflow");
  }
  return ++L->ci;
}